

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * __thiscall
ruckig::join<std::array<double,3ul>>
          (string *__return_storage_ptr__,ruckig *this,array<double,_3UL> *array,bool high_precision
          )

{
  _Setprecision _Var1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_1a0;
  size_t i;
  ostringstream ss;
  bool high_precision_local;
  array<double,_3UL> *array_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  local_1a0 = 0;
  while( true ) {
    sVar2 = std::array<double,_3UL>::size((array<double,_3UL> *)this);
    if (sVar2 <= local_1a0) break;
    if (local_1a0 != 0) {
      std::operator<<((ostream *)&i,", ");
    }
    if (((ulong)array & 1) != 0) {
      _Var1 = std::setprecision(0x10);
      std::operator<<((ostream *)&i,_Var1);
    }
    pvVar3 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)this,local_1a0);
    std::ostream::operator<<(&i,*pvVar3);
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

inline std::string join(const Vector& array, bool high_precision = false) {
    std::ostringstream ss;
    for (size_t i = 0; i < array.size(); ++i) {
        if (i) ss << ", ";
        if (high_precision) ss << std::setprecision(16);
        ss << array[i];
    }
    return ss.str();
}